

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

bool flatbuffers::StringToFloatImpl<float>(float *val,char *str)

{
  bool bVar1;
  float fVar2;
  char *end;
  char *local_20;
  
  if ((val != (float *)0x0) && (str != (char *)0x0)) {
    local_20 = str;
    strtoval_impl(val,str,&local_20);
    fVar2 = 0.0;
    if ((local_20 == str) || (*local_20 != '\0')) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (!NAN(*val)) {
        return true;
      }
      fVar2 = NAN;
    }
    *val = fVar2;
    return bVar1;
  }
  __assert_fail("str && val",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                ,0x138,"bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = float]");
}

Assistant:

inline bool StringToFloatImpl(T *val, const char *const str) {
  // Type T must be either float or double.
  FLATBUFFERS_ASSERT(str && val);
  auto end = str;
  strtoval_impl(val, str, const_cast<char **>(&end));
  auto done = (end != str) && (*end == '\0');
  if (!done) *val = 0;  // erase partial result
  if (done && std::isnan(*val)) { *val = std::numeric_limits<T>::quiet_NaN(); }
  return done;
}